

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<double,_6>::TPZManVector(TPZManVector<double,_6> *this,TPZManVector<double,_6> *copy)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  
  (this->super_TPZVec<double>).fStore = (double *)0x0;
  (this->super_TPZVec<double>).fNElements = 0;
  (this->super_TPZVec<double>).fNAlloc = 0;
  (this->super_TPZVec<double>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_016ad0e0;
  uVar4 = (copy->super_TPZVec<double>).fNElements;
  if ((long)uVar4 < 7) {
    pdVar2 = this->fExtAlloc;
    uVar3 = 0;
  }
  else {
    pdVar2 = (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    uVar3 = uVar4;
  }
  (this->super_TPZVec<double>).fStore = pdVar2;
  (this->super_TPZVec<double>).fNElements = uVar4;
  (this->super_TPZVec<double>).fNAlloc = uVar3;
  pdVar1 = (copy->super_TPZVec<double>).fStore;
  uVar3 = 0;
  if ((long)uVar4 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pdVar2[uVar3] = pdVar1[uVar3];
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}